

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DARKEN_LEVEL(effect_handler_context_t_conflict *context)

{
  bool full_00;
  _Bool full;
  effect_handler_context_t_conflict *context_local;
  
  full_00 = (context->value).base != L'\0';
  if (full_00) {
    msg("A great blackness rolls through the dungeon...");
  }
  wiz_dark((chunk *)cave,player,full_00);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DARKEN_LEVEL(effect_handler_context_t *context)
{
	bool full = context->value.base ? true : false;
	if (full)
		msg("A great blackness rolls through the dungeon...");
	wiz_dark(cave, player, full);
	context->ident = true;
	return true;
}